

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O0

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::tiles(vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>
                    *__return_storage_ptr__,LngLatBbox *llbbox,int *zoom)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  reference pLVar4;
  double *pdVar5;
  int *piVar6;
  iterator iVar7;
  iterator __last;
  reference piVar8;
  Tile TVar9;
  Tile TVar10;
  int local_25c;
  int local_258;
  value_type local_208;
  int local_1fc;
  iterator iStack_1f8;
  int j;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  iterator iStack_1d8;
  int i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  allocator<int> local_1a9;
  int local_1a8;
  int local_1a4;
  undefined1 local_1a0 [8];
  vector<int,_std::allocator<int>_> y;
  allocator<int> local_171;
  int local_170;
  int local_16c;
  undefined1 local_168 [8];
  vector<int,_std::allocator<int>_> x;
  int ury;
  int llx;
  int local_134;
  int iStack_130;
  Tile ur;
  int local_118;
  int iStack_114;
  Tile ll;
  double local_100;
  double n;
  double local_f0;
  double e;
  double local_e0;
  double s;
  double local_d0;
  double w;
  LngLatBbox bbox;
  iterator __end1;
  iterator __begin1;
  vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *__range1;
  value_type local_88;
  value_type local_58;
  undefined1 local_38 [8];
  vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> bboxes;
  int *zoom_local;
  LngLatBbox *llbbox_local;
  vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *return_tiles;
  
  bboxes.super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)zoom;
  std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::vector
            ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)local_38
            );
  if (llbbox->west < llbbox->east || llbbox->west == llbbox->east) {
    std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::push_back
              ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)
               local_38,llbbox);
  }
  else {
    local_58.west = -180.0;
    local_58.south = llbbox->south;
    local_58.east = llbbox->east;
    local_58.north = llbbox->north;
    std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::push_back
              ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)
               local_38,&local_58);
    local_88.west = llbbox->west;
    local_88.south = llbbox->south;
    local_88.east = 180.0;
    local_88.north = llbbox->north;
    std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::push_back
              ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)
               local_38,&local_88);
  }
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::vector
            (__return_storage_ptr__);
  __end1 = std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::begin
                     ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *
                      )local_38);
  bbox.north = (double)std::
                       vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::
                       end((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                            *)local_38);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<mercatortile::LngLatBbox_*,_std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>_>
                                     *)&bbox.north), bVar2) {
    pLVar4 = __gnu_cxx::
             __normal_iterator<mercatortile::LngLatBbox_*,_std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>_>
             ::operator*(&__end1);
    w = pLVar4->west;
    bbox.west = pLVar4->south;
    bbox.south = pLVar4->east;
    bbox.east = pLVar4->north;
    s = -180.0;
    pdVar5 = std::max<double>(&s,&w);
    local_d0 = *pdVar5;
    e = -85.051129;
    pdVar5 = std::max<double>(&e,&bbox.west);
    local_e0 = *pdVar5;
    n = 180.0;
    pdVar5 = std::min<double>(&n,&bbox.south);
    local_f0 = *pdVar5;
    stack0xfffffffffffffef8 = 0x40554345b291b824;
    pdVar5 = std::min<double>((double *)&ll.z,&bbox.east);
    local_100 = *pdVar5;
    TVar9 = tile(&local_d0,&local_e0,
                 (int *)bboxes.
                        super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ll.x = TVar9.z;
    TVar10 = tile(&local_f0,&local_100,
                  (int *)bboxes.
                         super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_118 = TVar9.x;
    if (local_118 < 0) {
      local_258 = 0;
    }
    else {
      local_258 = local_118;
    }
    x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = local_258;
    iStack_130 = TVar10.y;
    if (TVar10._0_8_ < 0) {
      local_25c = 0;
    }
    else {
      local_25c = iStack_130;
    }
    x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = local_25c;
    local_134 = TVar10.x;
    local_16c = local_134 + 1;
    _Var1 = std::pow<int,int>(2,*(int *)&(bboxes.
                                          super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->west)
    ;
    local_170 = (int)_Var1;
    piVar6 = std::min<int>(&local_16c,&local_170);
    iVar3 = *piVar6 - x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<int>::allocator(&local_171);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar3,&local_171);
    std::allocator<int>::~allocator(&local_171);
    iVar7 = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)local_168);
    y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::end<std::vector<int,std::allocator<int>>>
                            ((vector<int,_std::allocator<int>_> *)local_168);
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,
               x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_);
    iStack_114 = TVar9.y;
    local_1a4 = iStack_114 + 1;
    _Var1 = std::pow<int,int>(2,*(int *)&(bboxes.
                                          super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->west)
    ;
    local_1a8 = (int)_Var1;
    piVar6 = std::min<int>(&local_1a4,&local_1a8);
    iVar3 = *piVar6 - (int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
    std::allocator<int>::allocator(&local_1a9);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1a0,(long)iVar3,&local_1a9);
    std::allocator<int>::~allocator(&local_1a9);
    iVar7 = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)local_1a0);
    __last = std::end<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)local_1a0);
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
               (int)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_168);
    iStack_1d8 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_168);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe28), bVar2) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar3 = *piVar8;
      __end3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_1a0);
      iStack_1f8 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_1a0);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffe08), bVar2) {
        piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        local_208.y = *piVar8;
        local_208.z = *(int *)&(bboxes.
                                super__Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->west;
        local_208.x = iVar3;
        local_1fc = local_208.y;
        std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
                  (__return_storage_ptr__,&local_208);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1a0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_168);
    __gnu_cxx::
    __normal_iterator<mercatortile::LngLatBbox_*,_std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>_>
    ::operator++(&__end1);
  }
  std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::~vector
            ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)local_38
            );
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tile> tiles(const LngLatBbox &llbbox, const int &zoom)
{
    vector<LngLatBbox> bboxes;
    if (llbbox.west > llbbox.east)
    {
        bboxes.push_back(LngLatBbox{-180.0, llbbox.south, llbbox.east, llbbox.north});
        bboxes.push_back(LngLatBbox{llbbox.west, llbbox.south, 180.0, llbbox.north});
    }
    else
    {
        bboxes.push_back(llbbox);
    }

    vector<Tile> return_tiles;
    for (auto bbox : bboxes)
    {
        double w = max(-180.0, bbox.west);
        double s = max(-85.051129, bbox.south);
        double e = min(180.0, bbox.east);
        double n = min(85.051129, bbox.north);

        Tile ll = tile(w, s, zoom);
        Tile ur = tile(e, n, zoom);

        // Clamp left x and top y at 0.
        int llx = (ll.x < 0) ? 0 : ll.x;
        int ury = (ur.y < 0) ? 0 : ur.y;

        std::vector<int> x(min(ur.x + 1, int(pow(2, zoom))) - llx);
        std::iota(std::begin(x), std::end(x), llx);
        std::vector<int> y(min(ll.y + 1, int(pow(2, zoom))) - ury);
        std::iota(std::begin(y), std::end(y), ury);

        for (auto i : x)
        {
            for (auto j : y)
            {
                return_tiles.push_back(Tile{i, j, zoom});
            }
        }
    }
    return return_tiles;
}